

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O2

void __thiscall
t_javame_generator::generate_java_struct_equality
          (t_javame_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  e_req eVar2;
  pointer pptVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  pointer pptVar7;
  string name;
  string unequal;
  string this_present;
  string that_present;
  string local_140;
  string local_120;
  pointer local_100;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  t_type *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  t_generator::indent_abi_cxx11_(&local_f8,(t_generator *)this);
  poVar6 = std::operator<<(out,(string *)&local_f8);
  poVar6 = std::operator<<(poVar6,"public boolean equals(Object that) {");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_f8);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_f8,(t_generator *)this);
  poVar6 = std::operator<<(out,(string *)&local_f8);
  poVar6 = std::operator<<(poVar6,"if (that == null)");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_b8,(t_generator *)this);
  poVar6 = std::operator<<(poVar6,(string *)&local_b8);
  poVar6 = std::operator<<(poVar6,"  return false;");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_78,(t_generator *)this);
  poVar6 = std::operator<<(poVar6,(string *)&local_78);
  poVar6 = std::operator<<(poVar6,"if (that instanceof ");
  iVar5 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar6 = std::operator<<(poVar6,(string *)CONCAT44(extraout_var,iVar5));
  poVar6 = std::operator<<(poVar6,")");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_d8,(t_generator *)this);
  poVar6 = std::operator<<(poVar6,(string *)&local_d8);
  poVar6 = std::operator<<(poVar6,"  return this.equals((");
  iVar5 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar6 = std::operator<<(poVar6,(string *)CONCAT44(extraout_var_00,iVar5));
  poVar6 = std::operator<<(poVar6,")that);");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_120,(t_generator *)this);
  poVar6 = std::operator<<(poVar6,(string *)&local_120);
  poVar6 = std::operator<<(poVar6,"return false;");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_f8);
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_f8,(t_generator *)this);
  poVar6 = std::operator<<(out,(string *)&local_f8);
  poVar6 = std::operator<<(poVar6,"public boolean equals(");
  iVar5 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar6 = std::operator<<(poVar6,(string *)CONCAT44(extraout_var_01,iVar5));
  poVar6 = std::operator<<(poVar6," that) {");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_f8);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_f8,(t_generator *)this);
  poVar6 = std::operator<<(out,(string *)&local_f8);
  poVar6 = std::operator<<(poVar6,"if (that == null)");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_b8,(t_generator *)this);
  poVar6 = std::operator<<(poVar6,(string *)&local_b8);
  poVar6 = std::operator<<(poVar6,"  return false;");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_78,(t_generator *)this);
  poVar6 = std::operator<<(poVar6,(string *)&local_78);
  poVar6 = std::operator<<(poVar6,"if (this == that)");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_d8,(t_generator *)this);
  poVar6 = std::operator<<(poVar6,(string *)&local_d8);
  poVar6 = std::operator<<(poVar6,"  return true;");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_f8);
  pptVar7 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    pptVar3 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    if (pptVar7 == pptVar3) {
      poVar6 = t_generator::indent((t_generator *)this,out);
      poVar6 = std::operator<<(poVar6,"return true;");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_oop_generator::scope_down(&this->super_t_oop_generator,out);
      std::operator<<(out,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_f8,(t_generator *)this);
      poVar6 = std::operator<<(out,(string *)&local_f8);
      poVar6 = std::operator<<(poVar6,"public int hashCode() {");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_f8);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      poVar6 = t_generator::indent((t_generator *)this,out);
      poVar6 = std::operator<<(poVar6,"return 0;");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      poVar6 = t_generator::indent((t_generator *)this,out);
      poVar6 = std::operator<<(poVar6,"}");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      return;
    }
    local_58 = t_type::get_true_type((*pptVar7)->type_);
    eVar2 = (*pptVar7)->req_;
    bVar4 = type_can_be_null(this,local_58);
    local_100 = pptVar7;
    std::__cxx11::string::string((string *)&local_f8,(string *)&(*pptVar7)->name_);
    std::__cxx11::string::string((string *)&local_b8,"true",(allocator *)&local_78);
    std::__cxx11::string::string((string *)&local_78,"true",(allocator *)&local_d8);
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    local_d8._M_string_length = 0;
    local_d8.field_2._M_local_buf[0] = '\0';
    if (eVar2 == T_OPTIONAL || bVar4) {
      generate_isset_check_abi_cxx11_(&local_140,this,*local_100);
      std::operator+(&local_120," && this.",&local_140);
      std::__cxx11::string::append((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_140);
      generate_isset_check_abi_cxx11_(&local_140,this,*local_100);
      std::operator+(&local_120," && that.",&local_140);
      std::__cxx11::string::append((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_140);
    }
    t_generator::indent_abi_cxx11_(&local_120,(t_generator *)this);
    poVar6 = std::operator<<(out,(string *)&local_120);
    poVar6 = std::operator<<(poVar6,"boolean this_present_");
    poVar6 = std::operator<<(poVar6,(string *)&local_f8);
    poVar6 = std::operator<<(poVar6," = ");
    poVar6 = std::operator<<(poVar6,(string *)&local_b8);
    poVar6 = std::operator<<(poVar6,";");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_140,(t_generator *)this);
    poVar6 = std::operator<<(poVar6,(string *)&local_140);
    poVar6 = std::operator<<(poVar6,"boolean that_present_");
    poVar6 = std::operator<<(poVar6,(string *)&local_f8);
    poVar6 = std::operator<<(poVar6," = ");
    poVar6 = std::operator<<(poVar6,(string *)&local_78);
    poVar6 = std::operator<<(poVar6,";");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
    poVar6 = std::operator<<(poVar6,(string *)&local_98);
    poVar6 = std::operator<<(poVar6,"if (");
    poVar6 = std::operator<<(poVar6,"this_present_");
    poVar6 = std::operator<<(poVar6,(string *)&local_f8);
    poVar6 = std::operator<<(poVar6," || that_present_");
    poVar6 = std::operator<<(poVar6,(string *)&local_f8);
    poVar6 = std::operator<<(poVar6,") {");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_120);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_(&local_120,(t_generator *)this);
    poVar6 = std::operator<<(out,(string *)&local_120);
    poVar6 = std::operator<<(poVar6,"if (!(");
    poVar6 = std::operator<<(poVar6,"this_present_");
    poVar6 = std::operator<<(poVar6,(string *)&local_f8);
    poVar6 = std::operator<<(poVar6," && that_present_");
    poVar6 = std::operator<<(poVar6,(string *)&local_f8);
    poVar6 = std::operator<<(poVar6,"))");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_140,(t_generator *)this);
    poVar6 = std::operator<<(poVar6,(string *)&local_140);
    poVar6 = std::operator<<(poVar6,"  return false;");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_120);
    iVar5 = (*(local_58->super_t_doc)._vptr_t_doc[7])();
    if ((char)iVar5 == '\0') {
      if (bVar4) {
        std::operator+(&local_50,"!this.",&local_f8);
        std::operator+(&local_98,&local_50,".equals(that.");
        std::operator+(&local_140,&local_98,&local_f8);
        std::operator+(&local_120,&local_140,")");
        goto LAB_0021c682;
      }
      std::operator+(&local_98,"this.",&local_f8);
      std::operator+(&local_140,&local_98," != that.");
      std::operator+(&local_120,&local_140,&local_f8);
      std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_120);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_140);
      this_00 = &local_98;
    }
    else {
      std::operator+(&local_50,"TBaseHelper.compareTo(this.",&local_f8);
      std::operator+(&local_98,&local_50,", that.");
      std::operator+(&local_140,&local_98,&local_f8);
      std::operator+(&local_120,&local_140,") != 0");
LAB_0021c682:
      std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_120);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_98);
      this_00 = &local_50;
    }
    std::__cxx11::string::~string((string *)this_00);
    t_generator::indent_abi_cxx11_(&local_120,(t_generator *)this);
    poVar6 = std::operator<<(out,(string *)&local_120);
    poVar6 = std::operator<<(poVar6,"if (");
    poVar6 = std::operator<<(poVar6,(string *)&local_d8);
    poVar6 = std::operator<<(poVar6,")");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_140,(t_generator *)this);
    poVar6 = std::operator<<(poVar6,(string *)&local_140);
    poVar6 = std::operator<<(poVar6,"  return false;");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_120);
    t_oop_generator::scope_down(&this->super_t_oop_generator,out);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_f8);
    pptVar7 = local_100 + 1;
  } while( true );
}

Assistant:

void t_javame_generator::generate_java_struct_equality(ostream& out, t_struct* tstruct) {
  out << indent() << "public boolean equals(Object that) {" << endl;
  indent_up();
  out << indent() << "if (that == null)" << endl << indent() << "  return false;" << endl
      << indent() << "if (that instanceof " << tstruct->get_name() << ")" << endl << indent()
      << "  return this.equals((" << tstruct->get_name() << ")that);" << endl << indent()
      << "return false;" << endl;
  scope_down(out);
  out << endl;

  out << indent() << "public boolean equals(" << tstruct->get_name() << " that) {" << endl;
  indent_up();
  out << indent() << "if (that == null)" << endl << indent() << "  return false;" << endl
      << indent() << "if (this == that)" << endl << indent() << "  return true;"  << endl;

  const vector<t_field*>& members = tstruct->get_members();
  vector<t_field*>::const_iterator m_iter;
  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    out << endl;

    t_type* t = get_true_type((*m_iter)->get_type());
    // Most existing Thrift code does not use isset or optional/required,
    // so we treat "default" fields as required.
    bool is_optional = (*m_iter)->get_req() == t_field::T_OPTIONAL;
    bool can_be_null = type_can_be_null(t);
    string name = (*m_iter)->get_name();

    string this_present = "true";
    string that_present = "true";
    string unequal;

    if (is_optional || can_be_null) {
      this_present += " && this." + generate_isset_check(*m_iter);
      that_present += " && that." + generate_isset_check(*m_iter);
    }

    out << indent() << "boolean this_present_" << name << " = " << this_present << ";" << endl
        << indent() << "boolean that_present_" << name << " = " << that_present << ";" << endl
        << indent() << "if ("
        << "this_present_" << name << " || that_present_" << name << ") {" << endl;
    indent_up();
    out << indent() << "if (!("
        << "this_present_" << name << " && that_present_" << name << "))" << endl << indent()
        << "  return false;" << endl;

    if (t->is_binary()) {
      unequal = "TBaseHelper.compareTo(this." + name + ", that." + name + ") != 0";
    } else if (can_be_null) {
      unequal = "!this." + name + ".equals(that." + name + ")";
    } else {
      unequal = "this." + name + " != that." + name;
    }

    out << indent() << "if (" << unequal << ")" << endl << indent() << "  return false;" << endl;

    scope_down(out);
  }
  out << endl;
  indent(out) << "return true;" << endl;
  scope_down(out);
  out << endl;

  out << indent() << "public int hashCode() {" << endl;
  indent_up();
  indent(out) << "return 0;" << endl;
  indent_down();
  indent(out) << "}" << endl << endl;
}